

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O3

int __thiscall TPZMatrix<Fad<float>_>::Decompose_LDLt(TPZMatrix<Fad<float>_> *this)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  float *pfVar6;
  float *pfVar7;
  int i;
  ulong uVar8;
  float *pfVar9;
  float *pfVar10;
  double dVar11;
  ulong uVar12;
  value_type vVar13;
  Fad<float> tmp;
  Fad<float> sum_1;
  Fad<float> val;
  Fad<float> sum;
  Fad<float> local_148;
  Fad<float> local_128;
  Fad<float> local_108;
  double local_e8;
  ulong local_e0;
  ulong local_d8;
  FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_Fad<float>_>_> local_d0;
  undefined1 local_c0 [32];
  Fad<float> local_a0;
  Fad<float> local_80;
  FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_Fad<float>_>_> *local_60;
  Fad<float> *local_58;
  FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_> local_40;
  
  bVar1 = (this->super_TPZBaseMatrix).fDecomposed;
  if (bVar1 != 0) {
    if (bVar1 == 4) {
      return (uint)bVar1;
    }
    Error("Decompose_LDLt <Matrix already Decomposed with other scheme> ",(char *)0x0);
  }
  lVar5 = (this->super_TPZBaseMatrix).fRow;
  if (lVar5 != (this->super_TPZBaseMatrix).fCol) {
    Error("Decompose_LDLt <Matrix must be square>",(char *)0x0);
    lVar5 = (this->super_TPZBaseMatrix).fRow;
  }
  if (0 < (int)(uint)lVar5) {
    local_e0 = (ulong)((uint)lVar5 & 0x7fffffff);
    local_d8 = 1;
    dVar11 = (double)0;
    do {
      local_a0.val_ = 0.0;
      local_a0.dx_.num_elts = 0;
      local_a0.dx_.ptr_to_data = (float *)0x0;
      local_a0.defaultVal = 0.0;
      if (dVar11 != 0.0) {
        uVar12 = 0;
        do {
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                    (&local_148,this,uVar12,uVar12);
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                    (&local_128,this,uVar12,dVar11);
          local_60 = (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_Fad<float>_>_>
                      *)&local_148;
          local_58 = &local_128;
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                    (&local_108,this,uVar12,dVar11);
          local_c0._0_8_ = (Fad<float> *)&local_60;
          local_c0._8_8_ = &local_108;
          Fad<float>::operator+=
                    (&local_a0,
                     (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_>,_Fad<float>_>_>
                      *)local_c0);
          Fad<float>::~Fad(&local_108);
          Fad<float>::~Fad(&local_128);
          Fad<float>::~Fad(&local_148);
          uVar12 = uVar12 + 1;
        } while (dVar11 != (double)uVar12);
      }
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                (&local_128,this,dVar11,dVar11);
      iVar4 = local_a0.dx_.num_elts;
      iVar3 = local_128.dx_.num_elts;
      local_148.val_ = local_128.val_ - local_a0.val_;
      uVar2 = local_a0.dx_.num_elts;
      if (local_a0.dx_.num_elts < local_128.dx_.num_elts) {
        uVar2 = local_128.dx_.num_elts;
      }
      local_148.dx_.num_elts = 0;
      local_148.dx_.ptr_to_data = (float *)0x0;
      if (0 < (int)uVar2) {
        local_148.dx_.num_elts = uVar2;
        local_148.dx_.ptr_to_data = (float *)operator_new__((ulong)uVar2 * 4);
        uVar12 = 0;
        pfVar6 = local_128.dx_.ptr_to_data;
        pfVar7 = local_a0.dx_.ptr_to_data;
        do {
          pfVar9 = pfVar6;
          if (iVar3 == 0) {
            pfVar9 = &local_128.defaultVal;
          }
          pfVar10 = pfVar7;
          if (iVar4 == 0) {
            pfVar10 = &local_a0.defaultVal;
          }
          *(float *)((long)local_148.dx_.ptr_to_data + uVar12 * 4) = *pfVar9 - *pfVar10;
          uVar12 = uVar12 + 1;
          pfVar7 = pfVar7 + 1;
          pfVar6 = pfVar6 + 1;
        } while (uVar2 != uVar12);
      }
      local_148.defaultVal = 0.0;
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                (this,dVar11,dVar11,&local_148);
      Fad<float>::~Fad(&local_148);
      Fad<float>::~Fad(&local_128);
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                (&local_148,this,dVar11,dVar11);
      iVar3 = local_148.dx_.num_elts;
      local_80.val_ = local_148.val_;
      local_80.dx_.num_elts = local_148.dx_.num_elts;
      local_80.dx_.ptr_to_data = (float *)0x0;
      if ((long)local_148.dx_.num_elts != 0) {
        uVar12 = (long)local_148.dx_.num_elts * 4;
        if (local_148.dx_.num_elts < 0) {
          uVar12 = 0xffffffffffffffff;
        }
        local_80.dx_.ptr_to_data = (float *)operator_new__(uVar12);
        MEM_CPY<float>::copy
                  ((MEM_CPY<float> *)local_80.dx_.ptr_to_data,
                   (EVP_PKEY_CTX *)local_148.dx_.ptr_to_data,(EVP_PKEY_CTX *)(ulong)(uint)iVar3);
      }
      local_80.defaultVal = local_148.defaultVal;
      local_e8 = (double)ABS(local_80.val_);
      Fad<float>::~Fad(&local_80);
      if (local_e8 < 1e-12) {
        Error("Decompose_LDLt <Zero on diagonal>",(char *)0x0);
      }
      local_e8 = (double)((long)dVar11 + 1);
      uVar12 = local_d8;
      if ((ulong)local_e8 < local_e0) {
        do {
          local_128.val_ = 0.0;
          local_128.dx_.num_elts = 0;
          local_128.dx_.ptr_to_data = (float *)0x0;
          local_128.defaultVal = 0.0;
          if (dVar11 != 0.0) {
            uVar8 = 0;
            do {
              (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                        (&local_108,this,uVar8,uVar8);
              (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                        ((Fad<float> *)local_c0,this,dVar11,uVar8);
              local_40.fadexpr_.left_ = &local_108;
              local_40.fadexpr_.right_ = (Fad<float> *)local_c0;
              (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                        ((Fad<float> *)&local_60,this,uVar12,uVar8);
              local_d0.fadexpr_.left_ = &local_40;
              local_d0.fadexpr_.right_ = (Fad<float> *)&local_60;
              Fad<float>::operator+=(&local_128,&local_d0);
              Fad<float>::~Fad((Fad<float> *)&local_60);
              Fad<float>::~Fad((Fad<float> *)local_c0);
              Fad<float>::~Fad(&local_108);
              uVar8 = uVar8 + 1;
            } while (dVar11 != (double)uVar8);
          }
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                    ((FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_> *)local_c0,this,uVar12,dVar11)
          ;
          local_d0.fadexpr_.right_ = &local_128;
          local_60 = &local_d0;
          local_108.val_ = ((float)local_c0._0_4_ - local_128.val_) / local_148.val_;
          uVar2 = local_128.dx_.num_elts;
          if (local_128.dx_.num_elts < (int)local_c0._8_4_) {
            uVar2 = local_c0._8_4_;
          }
          if ((int)uVar2 <= local_148.dx_.num_elts) {
            uVar2 = local_148.dx_.num_elts;
          }
          local_108.dx_.num_elts = 0;
          local_108.dx_.ptr_to_data = (float *)0x0;
          local_d0.fadexpr_.left_ = (FadExpr<FadBinaryMul<Fad<float>,_Fad<float>_>_> *)local_c0;
          if ((int)uVar2 < 1) {
            local_108.defaultVal = 0.0;
            local_58 = &local_148;
          }
          else {
            local_108.dx_.num_elts = uVar2;
            local_58 = &local_148;
            local_108.dx_.ptr_to_data = (float *)operator_new__((ulong)uVar2 * 4);
            local_108.defaultVal = 0.0;
            uVar8 = 0;
            do {
              vVar13 = FadBinaryDiv<FadExpr<FadBinaryMinus<Fad<float>,_Fad<float>_>_>,_Fad<float>_>
                       ::dx((FadBinaryDiv<FadExpr<FadBinaryMinus<Fad<float>,_Fad<float>_>_>,_Fad<float>_>
                             *)&local_60,(int)uVar8);
              local_108.dx_.ptr_to_data[uVar8] = vVar13;
              uVar8 = uVar8 + 1;
            } while (uVar2 != uVar8);
          }
          Fad<float>::~Fad((Fad<float> *)local_c0);
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                    (this,uVar12,dVar11,&local_108);
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                    (this,dVar11,uVar12,&local_108);
          Fad<float>::~Fad(&local_108);
          Fad<float>::~Fad(&local_128);
          uVar12 = uVar12 + 1;
        } while (uVar12 != local_e0);
      }
      Fad<float>::~Fad(&local_148);
      Fad<float>::~Fad(&local_a0);
      local_d8 = local_d8 + 1;
      dVar11 = local_e8;
    } while (local_e8 != (double)local_e0);
  }
  (this->super_TPZBaseMatrix).fDecomposed = '\x04';
  (this->super_TPZBaseMatrix).fDefPositive = '\0';
  return 1;
}

Assistant:

int TPZMatrix<TVar>::Decompose_LDLt() {
	
	if (  fDecomposed && fDecomposed != ELDLt) {
		Error( "Decompose_LDLt <Matrix already Decomposed with other scheme> " );
	} else if(fDecomposed ) {
		return ELDLt;
	}
	if ( Rows()!=Cols() ) Error( "Decompose_LDLt <Matrix must be square>" );
	
	const int dim=Rows();
	
	for (auto j = 0; j < dim; j++ ) {
        TVar sum = 0;
		for (auto k=0; k<j; k++) {
            if constexpr(is_complex<TVar>::value){
                sum +=GetVal(k,k)*std::conj(GetVal(k,j))*GetVal(k,j);
            }else{
                sum +=GetVal(k,k)*GetVal(k,j)*GetVal(k,j);
            }   
		}
        PutVal( j,j,GetVal(j,j) - sum );
		TVar tmp = GetVal(j,j);
		if ( IsZero(tmp) ) Error( "Decompose_LDLt <Zero on diagonal>" );
        for(auto l=j+1; l<dim;l++) {
            TVar sum = 0;
            for (auto k=0; k<j; k++) {
                if constexpr(is_complex<TVar>::value){
                    sum += GetVal(k,k)*std::conj(GetVal(j,k))*GetVal(l,k);
                }else{
                    sum += GetVal(k,k)*GetVal(j,k)*GetVal(l,k);
                }
			}
            TVar val = (GetVal(l,j) - sum)/tmp;
            PutVal(l,j,val);
            if constexpr(is_complex<TVar>::value){val=std::conj(val);}
            PutVal(j,l,val);
		}
	}
	fDecomposed  = ELDLt;
	fDefPositive = 0;
	return( 1 );
}